

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pool.hpp
# Opt level: O1

void __thiscall iutest::detail::iuPool::~iuPool(iuPool *this)

{
  pointer __src;
  pointer *pppiVar1;
  pointer ppiVar2;
  iuIObject *piVar3;
  pointer ppiVar4;
  
  ppiVar2 = (this->m_pool).
            super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppiVar4 = (this->m_pool).
            super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppiVar2 != ppiVar4) {
    __src = ppiVar2 + 1;
    do {
      piVar3 = *ppiVar2;
      if (__src != ppiVar4) {
        memmove(ppiVar2,__src,(long)ppiVar4 - (long)__src);
      }
      pppiVar1 = &(this->m_pool).
                  super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppiVar1 = *pppiVar1 + -1;
      if (piVar3 != (iuIObject *)0x0) {
        (*piVar3->_vptr_iuIObject[1])(piVar3);
      }
      ppiVar4 = (this->m_pool).
                super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (ppiVar2 != ppiVar4);
  }
  ppiVar2 = (this->m_pool).
            super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppiVar2 != (pointer)0x0) {
    operator_delete(ppiVar2,(long)(this->m_pool).
                                  super__Vector_base<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppiVar2
                   );
    return;
  }
  return;
}

Assistant:

~iuPool()
    {
        // すべて解放する
        for( pool::iterator it=m_pool.begin(); it != m_pool.end(); )
        {
            value_ptr p = *it;
            it = m_pool.erase(it);
            delete p;
        }
    }